

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O1

size_t __thiscall
CVmObjClass::list_class_props
          (CVmObjClass *this,vm_obj_id_t self,vm_meta_entry_t *entry,CVmObjList *lst,
          size_t starting_idx,int static_only)

{
  int iVar1;
  ulong uVar2;
  ushort uVar3;
  size_t sVar4;
  vm_prop_id_t vVar5;
  vm_obj_id_t source_obj;
  vm_val_t val;
  vm_obj_id_t local_4c;
  CVmObjClass *local_48;
  vm_val_t local_40;
  
  if (entry->func_xlat_cnt_ == 0) {
    sVar4 = 0;
  }
  else {
    uVar2 = 1;
    uVar3 = 2;
    sVar4 = 0;
    local_48 = this;
    do {
      if (uVar3 == 1) {
        vVar5 = 0;
      }
      else {
        vVar5 = entry->func_xlat_[(int)uVar2 - 1];
      }
      if ((vVar5 != 0) &&
         ((static_only == 0 ||
          ((iVar1 = (*(local_48->super_CVmObject)._vptr_CVmObject[0xd])
                              (local_48,(ulong)vVar5,&local_40,self,&local_4c,0), iVar1 != 0 &&
           (local_4c == self)))))) {
        if (lst != (CVmObjList *)0x0) {
          local_40.typ = VM_PROP;
          local_40.val.prop = vVar5;
          CVmObjList::cons_set_element(lst,starting_idx,&local_40);
          starting_idx = starting_idx + 1;
        }
        sVar4 = sVar4 + 1;
      }
      uVar2 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar2 <= entry->func_xlat_cnt_);
  }
  return sVar4;
}

Assistant:

size_t CVmObjClass::list_class_props(VMG_ vm_obj_id_t self,
                                      vm_meta_entry_t *entry,
                                      CVmObjList *lst, size_t starting_idx,
                                      int static_only)
{
    ushort i;
    size_t cnt;
    size_t idx;
    
    /* count the valid entries */
    for (i = 1, idx = starting_idx, cnt = 0 ;
         i <= entry->func_xlat_cnt_ ; ++i)
    {
        vm_prop_id_t prop;
        vm_val_t val;
        vm_obj_id_t source_obj;

        /* get this property */
        prop = entry->xlat_func(i);
        
        /* 
         *   If this one's valid, check to see if it's we're interested in
         *   it.  If we want only statics, include it only if it's
         *   implemented as a static method on this intrinsic class object;
         *   otherwise, include it unconditionally.
         *   
         *   To determine if the property is implemented as a static, call
         *   the property on self without an argc pointer - this is the
         *   special form of the call which merely retrieves the value of the
         *   property without evaluating it.  If the property is defined on
         *   the object, and the source of the definition is self, include
         *   this one in the list of directly-defined properties.  
         */
        if (prop != VM_INVALID_PROP
            && (!static_only
                || (get_prop(vmg_ prop, &val, self, &source_obj, 0)
                    && source_obj == self)))
        {
            /* we're interested - add it to the list if we have one */
            if (lst != 0)
            {
                /* set up a value containing the property pointer */
                val.set_propid(prop);

                /* add it to the list at the next free slot */
                lst->cons_set_element(idx, &val);

                /* advance to the next slot */
                ++idx;
            }

            /* count it */
            ++cnt;
        }
    }

    /* return the number of properties we found */
    return cnt;
}